

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

reference __thiscall
absl::
InlinedVector<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,16ul,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>
::emplace_back<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>
          (InlinedVector<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,16ul,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>
           *this,QueueEntry *args)

{
  ulong uVar1;
  double dVar2;
  reference pQVar3;
  ulong uVar4;
  InlinedVector<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,16ul,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>
  *pIVar5;
  ulong uVar6;
  
  uVar1 = *(ulong *)this;
  uVar4 = uVar1 >> 1;
  if ((uVar1 & 1) == 0) {
    uVar6 = 0x10;
  }
  else {
    uVar6 = *(ulong *)(this + 8);
  }
  pIVar5 = this + 8;
  if (uVar6 < uVar4) {
    __assert_fail("s <= capacity()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                  ,0x217,
                  "reference absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry, 16>::emplace_back(Args &&...) [T = S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry, N = 16, A = std::allocator<S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry>, Args = <S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry>]"
                 );
  }
  if (uVar4 == uVar6) {
    pQVar3 = GrowAndEmplaceBack<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>(this,args);
    return pQVar3;
  }
  if (uVar4 < uVar6) {
    if ((uVar1 & 1) != 0) {
      pIVar5 = *(InlinedVector<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry,16ul,std::allocator<S2ClosestPointQueryBase<S2MinDistance,int>::QueueEntry>>
                 **)(this + 0x10);
    }
    *(ulong *)this = uVar1 + 2;
    dVar2 = (double)(args->id).id_;
    *(double *)(pIVar5 + uVar4 * 0x10) = (args->distance).super_S1ChordAngle.length2_;
    *(double *)(pIVar5 + uVar4 * 0x10 + 8) = dVar2;
    return (reference)(pIVar5 + uVar4 * 0x10);
  }
  __assert_fail("s < capacity()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/inlined_vector.h"
                ,0x21b,
                "reference absl::InlinedVector<S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry, 16>::emplace_back(Args &&...) [T = S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry, N = 16, A = std::allocator<S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry>, Args = <S2ClosestPointQueryBase<S2MinDistance, int>::QueueEntry>]"
               );
}

Assistant:

reference emplace_back(Args&&... args) {
    size_type s = size();
    assert(s <= capacity());
    if (ABSL_PREDICT_FALSE(s == capacity())) {
      return GrowAndEmplaceBack(std::forward<Args>(args)...);
    }
    assert(s < capacity());

    pointer space;
    if (allocated()) {
      tag().set_allocated_size(s + 1);
      space = allocated_space();
    } else {
      tag().set_inline_size(s + 1);
      space = inlined_space();
    }
    return Construct(space + s, std::forward<Args>(args)...);
  }